

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O3

void __thiscall
Symbol::SetHasMaybeEscapedUseInternal(Symbol *this,ByteCodeGenerator *byteCodeGenerator)

{
  ParseableFunctionInfo *pPVar1;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  undefined4 *puVar4;
  FuncInfo *pFVar5;
  FunctionInfo *pFVar6;
  char16_t *reason;
  
  if (this->hasMaybeEscapedUse == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/Symbol.cpp"
                       ,0x81,"(!hasMaybeEscapedUse)","!hasMaybeEscapedUse");
    if (!bVar3) goto LAB_008a5507;
    *puVar4 = 0;
  }
  if (this->symbolType == STFormal) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/Symbol.cpp"
                       ,0x82,"(!this->GetIsFormal())","!this->GetIsFormal()");
    if (!bVar3) goto LAB_008a5507;
    *puVar4 = 0;
  }
  this->hasMaybeEscapedUse = true;
  pFVar5 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
  sourceContextId =
       Js::FunctionProxy::GetSourceContextId(&pFVar5->byteCodeFunction->super_FunctionProxy);
  pFVar5 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
  pPVar1 = pFVar5->byteCodeFunction;
  pFVar6 = (pPVar1->super_FunctionProxy).functionInfo.ptr;
  if (pFVar6 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) {
LAB_008a5507:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    pFVar6 = (pPVar1->super_FunctionProxy).functionInfo.ptr;
  }
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015bc490,StackFuncPhase,sourceContextId,pFVar6->functionId);
  if (bVar3) {
    Output::Print(L"HasMaybeEscapedUse: %s\n",(this->name).string.ptr);
    Output::Flush();
  }
  if (this->hasFuncAssignment == true) {
    reason = L"MaybeEscapedUse";
    if (this->symbolType == STFunction) {
      reason = L"MaybeEscapedUseFuncDecl";
    }
    FuncInfo::SetHasMaybeEscapedNestedFunc(this->scope->func,reason);
    return;
  }
  return;
}

Assistant:

void Symbol::SetHasMaybeEscapedUseInternal(ByteCodeGenerator * byteCodeGenerator)
{
    Assert(!hasMaybeEscapedUse);
    Assert(!this->GetIsFormal());
    hasMaybeEscapedUse = true;
    if (PHASE_TESTTRACE(Js::StackFuncPhase, byteCodeGenerator->TopFuncInfo()->byteCodeFunction))
    {
        Output::Print(_u("HasMaybeEscapedUse: %s\n"), this->GetName().GetBuffer());
        Output::Flush();
    }
    if (this->GetHasFuncAssignment())
    {
        this->GetScope()->GetFunc()->SetHasMaybeEscapedNestedFunc(
            DebugOnly(this->symbolType == STFunction ? _u("MaybeEscapedUseFuncDecl") : _u("MaybeEscapedUse")));
    }
}